

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

MessageType __thiscall
cmMakefile::ExpandVariablesInStringNew
          (cmMakefile *this,string *errorstr,string *source,bool escapeQuotes,bool noEscapes,
          bool atOnly,char *filename,long line,bool replaceAt)

{
  char cVar1;
  undefined8 uVar2;
  bool bVar3;
  __type _Var4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  cmake *this_00;
  cmState *this_01;
  reference pvVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  string *psVar9;
  long lVar10;
  size_type sVar11;
  char *pcVar12;
  size_t sVar13;
  ulong uVar14;
  ostream *poVar15;
  string_view sVar16;
  string local_590 [32];
  undefined1 local_570 [8];
  ostringstream emsg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  string_view local_398;
  string local_388;
  cmValue local_368;
  cmValue def;
  string local_340 [8];
  string varresult_1;
  undefined1 local_318 [8];
  string variable;
  char *nextAt;
  char nextc_1;
  char *next_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string_view local_278;
  string_view local_268;
  char local_251;
  char *pcStack_250;
  char nextc;
  char *start;
  char *next;
  t_lookup lookup_1;
  string local_220;
  string *local_200;
  cmValue local_1f8;
  string *local_1f0;
  string local_1e8;
  cmAlphaNum local_1c8;
  string_view local_198;
  string_view local_188;
  cmAlphaNum local_170;
  string local_140;
  cmListFileContext *local_120;
  cmListFileContext *top;
  string svalue;
  string varresult;
  cmValue value;
  string *lookup;
  t_lookup var;
  char inc;
  cmState *state;
  MessageType mtype;
  bool done;
  bool error;
  vector<t_lookup,_std::allocator<t_lookup>_> openstack;
  string local_58 [8];
  string result;
  char *last;
  char *in;
  bool replaceAt_local;
  bool atOnly_local;
  bool noEscapes_local;
  bool escapeQuotes_local;
  string *source_local;
  string *errorstr_local;
  cmMakefile *this_local;
  
  last = (char *)std::__cxx11::string::c_str();
  result.field_2._8_8_ = last;
  std::__cxx11::string::string(local_58);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)local_58);
  std::vector<t_lookup,_std::allocator<t_lookup>_>::vector
            ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype);
  bVar3 = false;
  bVar6 = false;
  state._0_4_ = LOG;
  this_00 = GetCMakeInstance(this);
  this_01 = cmake::GetState(this_00);
  if ((ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
       ::lineVar_abi_cxx11_ == '\0') &&
     (iVar7 = __cxa_guard_acquire(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                                   ::lineVar_abi_cxx11_), iVar7 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                ::lineVar_abi_cxx11_,"CMAKE_CURRENT_LIST_LINE",
               (allocator<char> *)((long)&var.loc + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&var.loc + 7));
    __cxa_atexit(std::__cxx11::string::~string,
                 &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                  ::lineVar_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                         ::lineVar_abi_cxx11_);
  }
  do {
    var.loc._6_1_ = *last;
    if (var.loc._6_1_ == '\0') {
      bVar6 = true;
    }
    else if (var.loc._6_1_ == '\n') {
      line = line + 1;
    }
    else if (var.loc._6_1_ == '$') {
      if (atOnly) {
LAB_001fedbd:
        if (!noEscapes) {
          cVar1 = last[1];
          if (cVar1 == 't') {
            std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
            std::__cxx11::string::append((char *)local_58);
            result.field_2._8_8_ = last + 2;
          }
          else if (cVar1 == 'n') {
            std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
            std::__cxx11::string::append((char *)local_58);
            result.field_2._8_8_ = last + 2;
          }
          else if (cVar1 == 'r') {
            std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
            std::__cxx11::string::append((char *)local_58);
            result.field_2._8_8_ = last + 2;
          }
          else {
            if (cVar1 == ';') {
              bVar5 = std::vector<t_lookup,_std::allocator<t_lookup>_>::empty
                                ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype);
              if (bVar5) goto LAB_001fef7f;
            }
            iVar7 = isalnum((int)cVar1);
            if ((iVar7 == 0) && (cVar1 != '\0')) {
              std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
              result.field_2._8_8_ = last + 1;
            }
            else {
              std::__cxx11::string::operator+=((string *)errorstr,"Invalid character escape \'\\");
              if (cVar1 == '\0') {
                std::__cxx11::string::operator+=((string *)errorstr,"\' (at end of input).");
              }
              else {
                std::__cxx11::string::operator+=((string *)errorstr,cVar1);
                std::__cxx11::string::operator+=((string *)errorstr,"\'.");
              }
              bVar3 = true;
            }
          }
LAB_001fef7f:
          if (*(char *)result.field_2._8_8_ != '\0') {
            last = last + 1;
          }
        }
      }
      else {
        t_lookup::t_lookup((t_lookup *)&next);
        start = last + 1;
        pcStack_250 = (char *)0x0;
        local_251 = *start;
        if (local_251 == '{') {
          pcStack_250 = last + 2;
          next._0_4_ = 0;
        }
        else if (local_251 != '<') {
          if (local_251 == '\0') {
            std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
            result.field_2._8_8_ = start;
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_268,start);
            bVar5 = cmHasLiteralPrefix<5ul>(local_268,(char (*) [5])"ENV{");
            if (bVar5) {
              pcStack_250 = last + 5;
              next._0_4_ = 1;
            }
            else {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_278,start);
              bVar5 = cmHasLiteralPrefix<7ul>(local_278,(char (*) [7])"CACHE{");
              if (bVar5) {
                pcStack_250 = last + 7;
                next._0_4_ = 2;
              }
              else {
                bVar5 = cmsys::RegularExpression::find(&this->cmNamedCurly,start);
                pcVar12 = start;
                if (bVar5) {
                  sVar11 = cmsys::RegularExpression::end(&this->cmNamedCurly);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_2d8,pcVar12,sVar11,(allocator *)((long)&next_1 + 7));
                  std::operator+(&local_2b8,"Syntax $",&local_2d8);
                  std::operator+(&local_298,&local_2b8,
                                 "{} is not supported.  Only ${}, $ENV{}, and $CACHE{} are allowed."
                                );
                  std::__cxx11::string::operator=((string *)errorstr,(string *)&local_298);
                  std::__cxx11::string::~string((string *)&local_298);
                  std::__cxx11::string::~string((string *)&local_2b8);
                  std::__cxx11::string::~string((string *)&local_2d8);
                  std::allocator<char>::~allocator((allocator<char> *)((long)&next_1 + 7));
                  state._0_4_ = FATAL_ERROR;
                  bVar3 = true;
                }
              }
            }
          }
        }
        if (pcStack_250 != (char *)0x0) {
          std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
          result.field_2._8_8_ = pcStack_250;
          last = pcStack_250 + -1;
          lookup_1._0_8_ = std::__cxx11::string::size();
          std::vector<t_lookup,_std::allocator<t_lookup>_>::push_back
                    ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype,(value_type *)&next);
        }
      }
    }
    else if (var.loc._6_1_ == '@') {
      if (replaceAt) {
        pcVar12 = strchr(last + 1,0x40);
        variable.field_2._8_8_ = pcVar12;
        if ((pcVar12 != (char *)0x0) && (pcVar12 != last + 1)) {
          sVar13 = strspn(last + 1,
                          "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789/_.+-");
          if (pcVar12 == last + sVar13 + 1) {
            uVar14 = ~(ulong)last + variable.field_2._8_8_;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)local_318,last + 1,uVar14,
                       (allocator *)(varresult_1.field_2._M_local_buf + 0xf));
            std::allocator<char>::~allocator
                      ((allocator<char> *)(varresult_1.field_2._M_local_buf + 0xf));
            std::__cxx11::string::string(local_340);
            if (filename == (char *)0x0) {
LAB_001ff15f:
              local_368 = GetDefinition(this,(string *)local_318);
              bVar5 = cmValue::operator_cast_to_bool(&local_368);
              if (bVar5) {
                psVar9 = cmValue::operator*[abi_cxx11_(&local_368);
                std::__cxx11::string::operator=(local_340,(string *)psVar9);
              }
              else if ((this->SuppressSideEffects & 1U) == 0) {
                MaybeWarnUninitialized(this,(string *)local_318,filename);
              }
            }
            else {
              _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_318,
                                      &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                                       ::lineVar_abi_cxx11_);
              if (!_Var4) goto LAB_001ff15f;
              std::__cxx11::to_string((string *)&def,line);
              std::__cxx11::string::operator=(local_340,(string *)&def);
              std::__cxx11::string::~string((string *)&def);
            }
            if (escapeQuotes) {
              sVar16 = (string_view)
                       std::__cxx11::string::operator_cast_to_basic_string_view(local_340);
              local_398 = sVar16;
              cmEscapeQuotes_abi_cxx11_(&local_388,sVar16);
              std::__cxx11::string::operator=(local_340,(string *)&local_388);
              std::__cxx11::string::~string((string *)&local_388);
            }
            std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
            std::__cxx11::string::append(local_58);
            last = (char *)variable.field_2._8_8_;
            result.field_2._8_8_ = variable.field_2._8_8_ + 1;
            std::__cxx11::string::~string(local_340);
            std::__cxx11::string::~string((string *)local_318);
            goto LAB_001ff448;
          }
        }
      }
LAB_001ff2a4:
      bVar5 = std::vector<t_lookup,_std::allocator<t_lookup>_>::empty
                        ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype);
      if (!bVar5) {
        iVar7 = isalnum((int)var.loc._6_1_);
        if (((((iVar7 == 0) && (var.loc._6_1_ != '_')) && (var.loc._6_1_ != '/')) &&
            ((var.loc._6_1_ != '.' && (var.loc._6_1_ != '+')))) && (var.loc._6_1_ != '-')) {
          std::__cxx11::string::operator+=((string *)errorstr,"Invalid character (\'");
          std::__cxx11::string::operator+=((string *)errorstr,var.loc._6_1_);
          std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
          std::vector<t_lookup,_std::allocator<t_lookup>_>::back
                    ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype);
          std::__cxx11::string::substr((ulong)&local_3f8,(ulong)local_58);
          std::operator+(&local_3d8,"\') in a variable name: \'",&local_3f8);
          std::operator+(&local_3b8,&local_3d8,"\'");
          std::__cxx11::string::operator+=((string *)errorstr,(string *)&local_3b8);
          std::__cxx11::string::~string((string *)&local_3b8);
          std::__cxx11::string::~string((string *)&local_3d8);
          std::__cxx11::string::~string((string *)&local_3f8);
          state._0_4_ = FATAL_ERROR;
          bVar3 = true;
        }
      }
    }
    else {
      if (var.loc._6_1_ == '\\') goto LAB_001fedbd;
      if (var.loc._6_1_ != '}') goto LAB_001ff2a4;
      bVar5 = std::vector<t_lookup,_std::allocator<t_lookup>_>::empty
                        ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype);
      if (bVar5) goto LAB_001ff448;
      pvVar8 = std::vector<t_lookup,_std::allocator<t_lookup>_>::back
                         ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype);
      uVar2 = *(undefined8 *)pvVar8;
      var._0_8_ = pvVar8->loc;
      std::vector<t_lookup,_std::allocator<t_lookup>_>::pop_back
                ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype);
      std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
      std::__cxx11::string::substr((ulong)&value,(ulong)local_58);
      cmValue::cmValue((cmValue *)((long)&varresult.field_2 + 8),(nullptr_t)0x0);
      std::__cxx11::string::string((string *)(svalue.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)&top);
      lookup._0_4_ = (int)uVar2;
      if ((int)lookup == 0) {
        if (filename != (char *)0x0) {
          _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&value,
                                  &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                                   ::lineVar_abi_cxx11_);
          if (_Var4) {
            local_120 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                                  (&(this->Backtrace).
                                    super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
            bVar5 = std::optional::operator_cast_to_bool((optional *)&local_120->DeferId);
            if (bVar5) {
              sVar16 = (string_view)::cm::operator____s("DEFERRED:",9);
              local_198 = sVar16;
              local_188 = sVar16;
              cmAlphaNum::cmAlphaNum(&local_170,sVar16);
              str = std::
                    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&local_120->DeferId);
              cmAlphaNum::cmAlphaNum(&local_1c8,str);
              cmStrCat<>(&local_140,&local_170,&local_1c8);
              std::__cxx11::string::operator=
                        ((string *)(svalue.field_2._M_local_buf + 8),(string *)&local_140);
              std::__cxx11::string::~string((string *)&local_140);
            }
            else {
              std::__cxx11::to_string(&local_1e8,line);
              std::__cxx11::string::operator=
                        ((string *)(svalue.field_2._M_local_buf + 8),(string *)&local_1e8);
              std::__cxx11::string::~string((string *)&local_1e8);
            }
            goto LAB_001fe93a;
          }
        }
        local_1f0 = (string *)
                    GetDefinition(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&value);
        varresult.field_2._8_8_ = local_1f0;
      }
      else if ((int)lookup == 1) {
        bVar5 = cmsys::SystemTools::GetEnv
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &value,(string *)&top);
        if (bVar5) {
          cmValue::cmValue(&local_1f8,(string *)&top);
          varresult.field_2._8_8_ = local_1f8.Value;
        }
      }
      else if ((int)lookup == 2) {
        local_200 = (string *)
                    cmState::GetCacheEntryValue
                              (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&value);
        varresult.field_2._8_8_ = local_200;
      }
LAB_001fe93a:
      bVar5 = cmValue::operator_cast_to_bool((cmValue *)((long)&varresult.field_2 + 8));
      if (bVar5) {
        if (escapeQuotes) {
          psVar9 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&varresult.field_2 + 8));
          sVar16 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9);
          lookup_1.loc = sVar16._M_len;
          cmEscapeQuotes_abi_cxx11_(&local_220,sVar16);
          std::__cxx11::string::operator=
                    ((string *)(svalue.field_2._M_local_buf + 8),(string *)&local_220);
          std::__cxx11::string::~string((string *)&local_220);
        }
        else {
          psVar9 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&varresult.field_2 + 8));
          std::__cxx11::string::operator=
                    ((string *)(svalue.field_2._M_local_buf + 8),(string *)psVar9);
        }
      }
      else if ((this->SuppressSideEffects & 1U) == 0) {
        MaybeWarnUninitialized
                  (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                   filename);
      }
      uVar2 = var._0_8_;
      lVar10 = std::__cxx11::string::size();
      std::__cxx11::string::replace((ulong)local_58,uVar2,(string *)(lVar10 - var._0_8_));
      result.field_2._8_8_ = last + 1;
      std::__cxx11::string::~string((string *)&top);
      std::__cxx11::string::~string((string *)(svalue.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&value);
    }
LAB_001ff448:
    bVar5 = false;
    if ((!bVar3) && (bVar5 = false, !bVar6)) {
      bVar5 = last[1] != '\0';
      last = last + 1;
    }
    if (!bVar5) {
      if (!bVar3) {
        bVar6 = std::vector<t_lookup,_std::allocator<t_lookup>_>::empty
                          ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype);
        if (!bVar6) {
          std::__cxx11::string::operator+=
                    ((string *)errorstr,"There is an unterminated variable reference.");
          bVar3 = true;
        }
      }
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
        std::operator<<((ostream *)local_570,"Syntax error in cmake code ");
        if (filename != (char *)0x0) {
          poVar15 = std::operator<<((ostream *)local_570,"at\n");
          poVar15 = std::operator<<(poVar15,"  ");
          poVar15 = std::operator<<(poVar15,filename);
          poVar15 = std::operator<<(poVar15,":");
          poVar15 = (ostream *)std::ostream::operator<<(poVar15,line);
          std::operator<<(poVar15,"\n");
        }
        poVar15 = std::operator<<((ostream *)local_570,"when parsing string\n");
        poVar15 = std::operator<<(poVar15,"  ");
        poVar15 = std::operator<<(poVar15,(string *)source);
        std::operator<<(poVar15,"\n");
        std::operator<<((ostream *)local_570,(string *)errorstr);
        state._0_4_ = FATAL_ERROR;
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)errorstr,local_590);
        std::__cxx11::string::~string(local_590);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
      }
      else {
        std::__cxx11::string::append((char *)local_58);
        std::__cxx11::string::operator=((string *)source,local_58);
      }
      std::vector<t_lookup,_std::allocator<t_lookup>_>::~vector
                ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype);
      std::__cxx11::string::~string(local_58);
      return (MessageType)state;
    }
  } while( true );
}

Assistant:

MessageType cmMakefile::ExpandVariablesInStringNew(
  std::string& errorstr, std::string& source, bool escapeQuotes,
  bool noEscapes, bool atOnly, const char* filename, long line,
  bool replaceAt) const
{
  // This method replaces ${VAR} and @VAR@ where VAR is looked up
  // with GetDefinition(), if not found in the map, nothing is expanded.
  // It also supports the $ENV{VAR} syntax where VAR is looked up in
  // the current environment variables.

  const char* in = source.c_str();
  const char* last = in;
  std::string result;
  result.reserve(source.size());
  std::vector<t_lookup> openstack;
  bool error = false;
  bool done = false;
  MessageType mtype = MessageType::LOG;

  cmState* state = this->GetCMakeInstance()->GetState();

  static const std::string lineVar = "CMAKE_CURRENT_LIST_LINE";
  do {
    char inc = *in;
    switch (inc) {
      case '}':
        if (!openstack.empty()) {
          t_lookup var = openstack.back();
          openstack.pop_back();
          result.append(last, in - last);
          std::string const& lookup = result.substr(var.loc);
          cmValue value = nullptr;
          std::string varresult;
          std::string svalue;
          switch (var.domain) {
            case NORMAL:
              if (filename && lookup == lineVar) {
                cmListFileContext const& top = this->Backtrace.Top();
                if (top.DeferId) {
                  varresult = cmStrCat("DEFERRED:"_s, *top.DeferId);
                } else {
                  varresult = std::to_string(line);
                }
              } else {
                value = this->GetDefinition(lookup);
              }
              break;
            case ENVIRONMENT:
              if (cmSystemTools::GetEnv(lookup, svalue)) {
                value = cmValue(svalue);
              }
              break;
            case CACHE:
              value = state->GetCacheEntryValue(lookup);
              break;
          }
          // Get the string we're meant to append to.
          if (value) {
            if (escapeQuotes) {
              varresult = cmEscapeQuotes(*value);
            } else {
              varresult = *value;
            }
          } else if (!this->SuppressSideEffects) {
            this->MaybeWarnUninitialized(lookup, filename);
          }
          result.replace(var.loc, result.size() - var.loc, varresult);
          // Start looking from here on out.
          last = in + 1;
        }
        break;
      case '$':
        if (!atOnly) {
          t_lookup lookup;
          const char* next = in + 1;
          const char* start = nullptr;
          char nextc = *next;
          if (nextc == '{') {
            // Looking for a variable.
            start = in + 2;
            lookup.domain = NORMAL;
          } else if (nextc == '<') {
          } else if (!nextc) {
            result.append(last, next - last);
            last = next;
          } else if (cmHasLiteralPrefix(next, "ENV{")) {
            // Looking for an environment variable.
            start = in + 5;
            lookup.domain = ENVIRONMENT;
          } else if (cmHasLiteralPrefix(next, "CACHE{")) {
            // Looking for a cache variable.
            start = in + 7;
            lookup.domain = CACHE;
          } else {
            if (this->cmNamedCurly.find(next)) {
              errorstr = "Syntax $" +
                std::string(next, this->cmNamedCurly.end()) +
                "{} is not supported.  Only ${}, $ENV{}, "
                "and $CACHE{} are allowed.";
              mtype = MessageType::FATAL_ERROR;
              error = true;
            }
          }
          if (start) {
            result.append(last, in - last);
            last = start;
            in = start - 1;
            lookup.loc = result.size();
            openstack.push_back(lookup);
          }
          break;
        }
        CM_FALLTHROUGH;
      case '\\':
        if (!noEscapes) {
          const char* next = in + 1;
          char nextc = *next;
          if (nextc == 't') {
            result.append(last, in - last);
            result.append("\t");
            last = next + 1;
          } else if (nextc == 'n') {
            result.append(last, in - last);
            result.append("\n");
            last = next + 1;
          } else if (nextc == 'r') {
            result.append(last, in - last);
            result.append("\r");
            last = next + 1;
          } else if (nextc == ';' && openstack.empty()) {
            // Handled in ExpandListArgument; pass the backslash literally.
          } else if (isalnum(nextc) || nextc == '\0') {
            errorstr += "Invalid character escape '\\";
            if (nextc) {
              errorstr += nextc;
              errorstr += "'.";
            } else {
              errorstr += "' (at end of input).";
            }
            error = true;
          } else {
            // Take what we've found so far, skipping the escape character.
            result.append(last, in - last);
            // Start tracking from the next character.
            last = in + 1;
          }
          // Skip the next character since it was escaped, but don't read past
          // the end of the string.
          if (*last) {
            ++in;
          }
        }
        break;
      case '\n':
        // Onto the next line.
        ++line;
        break;
      case '\0':
        done = true;
        break;
      case '@':
        if (replaceAt) {
          const char* nextAt = strchr(in + 1, '@');
          if (nextAt && nextAt != in + 1 &&
              nextAt ==
                in + 1 +
                  strspn(in + 1,
                         "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                         "abcdefghijklmnopqrstuvwxyz"
                         "0123456789/_.+-")) {
            std::string variable(in + 1, nextAt - in - 1);

            std::string varresult;
            if (filename && variable == lineVar) {
              varresult = std::to_string(line);
            } else {
              cmValue def = this->GetDefinition(variable);
              if (def) {
                varresult = *def;
              } else if (!this->SuppressSideEffects) {
                this->MaybeWarnUninitialized(variable, filename);
              }
            }

            if (escapeQuotes) {
              varresult = cmEscapeQuotes(varresult);
            }
            // Skip over the variable.
            result.append(last, in - last);
            result.append(varresult);
            in = nextAt;
            last = in + 1;
            break;
          }
        }
        // Failed to find a valid @ expansion; treat it as literal.
        CM_FALLTHROUGH;
      default: {
        if (!openstack.empty() &&
            !(isalnum(inc) || inc == '_' || inc == '/' || inc == '.' ||
              inc == '+' || inc == '-')) {
          errorstr += "Invalid character (\'";
          errorstr += inc;
          result.append(last, in - last);
          errorstr += "\') in a variable name: "
                      "'" +
            result.substr(openstack.back().loc) + "'";
          mtype = MessageType::FATAL_ERROR;
          error = true;
        }
        break;
      }
    }
    // Look at the next character.
  } while (!error && !done && *++in);

  // Check for open variable references yet.
  if (!error && !openstack.empty()) {
    // There's an open variable reference waiting.  Policy CMP0010 flags
    // whether this is an error or not.  The new parser now enforces
    // CMP0010 as well.
    errorstr += "There is an unterminated variable reference.";
    error = true;
  }

  if (error) {
    std::ostringstream emsg;
    emsg << "Syntax error in cmake code ";
    if (filename) {
      // This filename and line number may be more specific than the
      // command context because one command invocation can have
      // arguments on multiple lines.
      emsg << "at\n"
           << "  " << filename << ":" << line << "\n";
    }
    emsg << "when parsing string\n"
         << "  " << source << "\n";
    emsg << errorstr;
    mtype = MessageType::FATAL_ERROR;
    errorstr = emsg.str();
  } else {
    // Append the rest of the unchanged part of the string.
    result.append(last);

    source = result;
  }

  return mtype;
}